

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

void ear::checkScreenSpeakers(Layout *layout)

{
  Channel *pCVar1;
  int iVar2;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar3;
  string *psVar4;
  not_implemented *this;
  invalid_argument *this_00;
  Channel *this_01;
  double dVar5;
  string local_50;
  
  pvVar3 = Layout::channels(layout);
  this_01 = (pvVar3->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (pvVar3->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_01 == pCVar1) {
      return;
    }
    psVar4 = Channel::name_abi_cxx11_(this_01);
    iVar2 = std::__cxx11::string::compare((char *)psVar4);
    if (iVar2 == 0) {
LAB_00143918:
      Channel::polarPosition(this_01);
      dVar5 = ABS((double)local_50._M_dataplus._M_p);
      if (((dVar5 < 5.0) || (25.0 <= dVar5)) && ((dVar5 < 35.0 || (60.0 <= dVar5)))) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 and 35 to 60 degrees"
                   ,"");
        std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
        *(undefined ***)this_00 = &PTR__invalid_argument_0019def0;
        __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      if (25.0 < dVar5) {
        this = (not_implemented *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "M+SC and M-SC with azimuths wider than 25 degrees are not currently supported",
                   "");
        not_implemented::not_implemented(this,&local_50);
        __cxa_throw(this,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      psVar4 = Channel::name_abi_cxx11_(this_01);
      iVar2 = std::__cxx11::string::compare((char *)psVar4);
      if (iVar2 == 0) goto LAB_00143918;
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void checkScreenSpeakers(const Layout& layout) {
    for (auto& channel : layout.channels()) {
      if (channel.name() == "M+SC" || channel.name() == "M-SC") {
        double abs_az = std::abs(channel.polarPosition().azimuth);
        if (!((5.0 <= abs_az && abs_az < 25.0) ||
              (35.0 <= abs_az && abs_az < 60.0))) {
          throw invalid_argument(
              "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 "
              "and 35 to 60 degrees");
        }

        if (25.0 < abs_az) {
          throw not_implemented(
              "M+SC and M-SC with azimuths wider than 25 degrees are not "
              "currently supported");
        }
      }
    }
  }